

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O1

type_conflict
dukglue_pcall_method<int,DukValue,int>(duk_context *ctx,DukValue *obj,char *method_name,int args)

{
  duk_int_t return_code;
  DukErrorException *this;
  int out;
  SafeMethodCallData<int,_DukValue,_int> data;
  type_conflict local_3c;
  DukValue *local_38;
  char *local_30;
  int local_28;
  type_conflict *local_20;
  
  local_20 = &local_3c;
  local_38 = obj;
  local_30 = method_name;
  local_28 = args;
  return_code = duk_safe_call(ctx,dukglue::detail::call_method_safe<int,DukValue,int>,&local_38,0,1)
  ;
  if (return_code == 0) {
    duk_pop(ctx);
    return local_3c;
  }
  this = (DukErrorException *)__cxa_allocate_exception(0x28);
  DukErrorException::DukErrorException(this,ctx,return_code,true);
  __cxa_throw(this,&DukErrorException::typeinfo,DukException::~DukException);
}

Assistant:

typename std::enable_if<!std::is_void<RetT>::value, RetT>::type dukglue_pcall_method(duk_context* ctx, const ObjT& obj, const char* method_name, ArgTs... args)
{
	RetT out;
	dukglue::detail::SafeMethodCallData<RetT, ObjT, ArgTs...> data {
		&obj, method_name, std::tuple<ArgTs...>(args...), &out
	};

	duk_idx_t rc = duk_safe_call(ctx, &dukglue::detail::call_method_safe<RetT, ObjT, ArgTs...>, (void*) &data, 0, 1);
	if (rc != 0)
		throw DukErrorException(ctx, rc);

	duk_pop(ctx);  // remove result from stack
	return std::move(out);
}